

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::WriteToMultipleSSBOCase::iterate
          (WriteToMultipleSSBOCase *this)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  deUint64 dVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deBool dVar8;
  RenderContext *pRVar9;
  char *pcVar10;
  ostream *poVar11;
  int *piVar12;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestLog *pTVar13;
  TestError *pTVar14;
  MessageBuilder *pMVar15;
  void *pvVar16;
  IVec3 *this_00;
  deUint32 local_ac8;
  deUint32 local_ab8;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  allocator<char> local_891;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  uint local_7cc;
  uint local_7c8;
  deUint32 ref_1;
  deUint32 res_1;
  deUint32 ndx_1;
  BufferMemMap bufMap_1;
  string local_7a0;
  string local_780;
  string local_760;
  allocator<char> local_739;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  deUint32 local_674;
  deUint32 local_670;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx;
  BufferMemMap bufMap;
  undefined1 local_4c8 [4];
  deUint32 block1Size;
  InterfaceVariableInfo value1Info;
  undefined1 local_470 [4];
  deUint32 value1Index;
  Buffer outputBuffer1;
  undefined1 local_450 [4];
  deUint32 block0Size;
  InterfaceVariableInfo value0Info;
  undefined1 local_3f8 [4];
  deUint32 value0Index;
  Buffer outputBuffer0;
  ShaderSource local_3c0;
  ProgramSources local_398;
  undefined1 local_2c8 [8];
  ShaderProgram program;
  Functions *gl;
  string local_1e8;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0;
  undefined1 local_190 [8];
  ostringstream src;
  GLSLVersion glslVersion;
  WriteToMultipleSSBOCase *this_local;
  
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  src._368_4_ = (*pRVar9->_vptr_RenderContext[2])();
  src._372_4_ = glu::getContextTypeGLSLVersion((ContextType)src._368_4_);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  pcVar10 = glu::getGLSLVersionDeclaration(src._372_4_);
  poVar11 = std::operator<<((ostream *)local_190,pcVar10);
  poVar11 = std::operator<<(poVar11,"\n");
  poVar11 = std::operator<<(poVar11,"layout (local_size_x = ");
  piVar12 = tcu::Vector<int,_3>::operator[](&this->m_localSize,0);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar12);
  poVar11 = std::operator<<(poVar11,", local_size_y = ");
  piVar12 = tcu::Vector<int,_3>::operator[](&this->m_localSize,1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar12);
  poVar11 = std::operator<<(poVar11,", local_size_z = ");
  piVar12 = tcu::Vector<int,_3>::operator[](&this->m_localSize,2);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*piVar12);
  poVar11 = std::operator<<(poVar11,") in;\n");
  poVar11 = std::operator<<(poVar11,"layout(binding = 0) buffer Out0 {\n");
  poVar11 = std::operator<<(poVar11,"    uint values[");
  local_1c2 = 0;
  if ((this->m_isSized & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1c2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c1);
  }
  else {
    de::toString<int>(&local_1c0,&this->m_numValues);
  }
  poVar11 = std::operator<<(poVar11,(string *)&local_1c0);
  poVar11 = std::operator<<(poVar11,"];\n");
  poVar11 = std::operator<<(poVar11,"} sb_out0;\n");
  poVar11 = std::operator<<(poVar11,"layout(binding = 1) buffer Out1 {\n");
  poVar11 = std::operator<<(poVar11,"    uint values[");
  gl._6_1_ = 0;
  if ((this->m_isSized & 1U) == 0) {
    std::allocator<char>::allocator();
    gl._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"",(allocator<char> *)((long)&gl + 7));
  }
  else {
    de::toString<int>(&local_1e8,&this->m_numValues);
  }
  poVar11 = std::operator<<(poVar11,(string *)&local_1e8);
  poVar11 = std::operator<<(poVar11,"];\n");
  poVar11 = std::operator<<(poVar11,"} sb_out1;\n");
  poVar11 = std::operator<<(poVar11,"void main (void) {\n");
  poVar11 = std::operator<<(poVar11,"    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar11 = std::operator<<(poVar11,
                            "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                           );
  poVar11 = std::operator<<(poVar11,"\n");
  poVar11 = std::operator<<(poVar11,"    {\n");
  poVar11 = std::operator<<(poVar11,
                            "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
                           );
  poVar11 = std::operator<<(poVar11,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar11 = std::operator<<(poVar11,"\n");
  poVar11 = std::operator<<(poVar11,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar11 = std::operator<<(poVar11,"            sb_out0.values[offset + ndx] = offset + ndx;\n");
  poVar11 = std::operator<<(poVar11,"    }\n");
  poVar11 = std::operator<<(poVar11,"    {\n");
  poVar11 = std::operator<<(poVar11,
                            "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
                           );
  poVar11 = std::operator<<(poVar11,"        uint offset          = numValuesPerInv*groupNdx;\n");
  poVar11 = std::operator<<(poVar11,"\n");
  poVar11 = std::operator<<(poVar11,"        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar11 = std::operator<<(poVar11,
                            "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
                           );
  poVar11 = std::operator<<(poVar11,"    }\n");
  std::operator<<(poVar11,"}\n");
  std::__cxx11::string::~string((string *)&local_1e8);
  if ((gl._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&gl + 7));
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((local_1c2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1c1);
  }
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar9->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = CONCAT44(extraout_var,iVar6);
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_398);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource
            (&local_3c0,SHADERTYPE_COMPUTE,(string *)&outputBuffer0.super_ObjectWrapper.m_object);
  sources = glu::ProgramSources::operator<<(&local_398,&local_3c0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2c8,pRVar9,sources);
  glu::ShaderSource::~ShaderSource(&local_3c0);
  std::__cxx11::string::~string((string *)&outputBuffer0.super_ObjectWrapper.m_object);
  glu::ProgramSources::~ProgramSources(&local_398);
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar13,(ShaderProgram *)local_2c8);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_2c8);
  if (!bVar5) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x206);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_3f8,pRVar9);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2c8);
  value0Info._76_4_ = (*pcVar3)(dVar7,0x92e5,"Out0.values");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2c8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_450,(Functions *)dVar4,dVar7,0x92e5,value0Info._76_4_);
  outputBuffer1.super_ObjectWrapper._20_4_ = value0Info.arraySize * this->m_numValues;
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_470,pRVar9);
  pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x9a8);
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2c8);
  value1Info._76_4_ = (*pcVar3)(dVar7,0x92e5,"Out1.values");
  dVar4 = program.m_program.m_info.linkTimeUs;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2c8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)local_4c8,(Functions *)dVar4,dVar7,0x92e5,value1Info._76_4_);
  iVar6 = value1Info.arraySize * this->m_numValues;
  do {
    dVar8 = ::deGetFalse();
    if (dVar8 != 0) {
LAB_023cf01a:
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,
                 "value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                 ,0x212);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if ((this->m_isSized & 1U) == 0) {
      local_ab8 = 0;
    }
    else {
      local_ab8 = this->m_numValues;
    }
    if (value0Info.atomicCounterBufferIndex != local_ab8) goto LAB_023cf01a;
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  while (dVar8 = ::deGetFalse(), dVar8 == 0) {
    if ((this->m_isSized & 1U) == 0) {
      local_ac8 = 0;
    }
    else {
      local_ac8 = this->m_numValues;
    }
    if (value1Info.atomicCounterBufferIndex != local_ac8) break;
    dVar8 = ::deGetFalse();
    if (dVar8 == 0) {
      pTVar13 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&bufMap.m_ptr,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message
                );
      pMVar15 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&bufMap.m_ptr,(char (*) [14])"Work groups: ");
      pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_workSize);
      tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bufMap.m_ptr);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
      dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2c8);
      (*pcVar3)(dVar7);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_3f8);
      (*pcVar3)(0x90d2,dVar7);
      (**(code **)(program.m_program.m_info.linkTimeUs + 0x150))
                (0x90d2,outputBuffer1.super_ObjectWrapper._20_4_,0,0x88e0);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x48);
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_3f8);
      (*pcVar3)(0x90d2,0,dVar7);
      dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar7,"Buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x21f);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_470);
      (*pcVar3)(0x90d2,dVar7);
      (**(code **)(program.m_program.m_info.linkTimeUs + 0x150))(0x90d2,iVar6,0,0x88e0);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x48);
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_470);
      (*pcVar3)(0x90d2,1,dVar7);
      dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar7,"Buffer setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x226);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x528);
      this_00 = &this->m_workSize;
      piVar12 = tcu::Vector<int,_3>::operator[](this_00,0);
      iVar1 = *piVar12;
      piVar12 = tcu::Vector<int,_3>::operator[](this_00,1);
      iVar2 = *piVar12;
      piVar12 = tcu::Vector<int,_3>::operator[](this_00,2);
      (*pcVar3)(iVar1,iVar2,*piVar12);
      dVar7 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
      glu::checkError(dVar7,"glDispatchCompute()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                      ,0x22b);
      pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_3f8);
      (*pcVar3)(0x90d2,dVar7);
      BufferMemMap::BufferMemMap
                ((BufferMemMap *)&res,(Functions *)program.m_program.m_info.linkTimeUs,0x90d2,0,
                 outputBuffer1.super_ObjectWrapper._20_4_,1);
      ref = 0;
      while( true ) {
        if ((uint)this->m_numValues <= ref) {
          BufferMemMap::~BufferMemMap((BufferMemMap *)&res);
          pcVar3 = *(code **)(program.m_program.m_info.linkTimeUs + 0x40);
          dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_470);
          (*pcVar3)(0x90d2,dVar7);
          BufferMemMap::BufferMemMap
                    ((BufferMemMap *)&res_1,(Functions *)program.m_program.m_info.linkTimeUs,0x90d2,
                     0,iVar6,1);
          ref_1 = 0;
          while( true ) {
            if ((uint)this->m_numValues <= ref_1) {
              BufferMemMap::~BufferMemMap((BufferMemMap *)&res_1);
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                         QP_TEST_RESULT_PASS,"Pass");
              glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_4c8)
              ;
              glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                        ((TypedObjectWrapper<(glu::ObjectType)1> *)local_470);
              glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)local_450)
              ;
              glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                        ((TypedObjectWrapper<(glu::ObjectType)1> *)local_3f8);
              glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
              return STOP;
            }
            pvVar16 = BufferMemMap::getPtr((BufferMemMap *)&res_1);
            local_7c8 = *(uint *)((long)pvVar16 +
                                 (ulong)(value1Info.arraySize * ref_1) + (ulong)value1Info.type);
            local_7cc = this->m_numValues - ref_1;
            if (local_7c8 != local_7cc) break;
            ref_1 = ref_1 + 1;
          }
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_890,"Comparison failed for Out1.values[",&local_891);
          de::toString<unsigned_int>(&local_8b8,&ref_1);
          std::operator+(&local_870,&local_890,&local_8b8);
          std::operator+(&local_850,&local_870,"] res=");
          de::toString<unsigned_int>(&local_8d8,&local_7c8);
          std::operator+(&local_830,&local_850,&local_8d8);
          std::operator+(&local_810,&local_830," ref=");
          de::toString<unsigned_int>(&local_8f8,&local_7cc);
          std::operator+(&local_7f0,&local_810,&local_8f8);
          tcu::TestError::TestError(pTVar14,&local_7f0);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pvVar16 = BufferMemMap::getPtr((BufferMemMap *)&res);
        local_670 = *(deUint32 *)
                     ((long)pvVar16 + (ulong)(value0Info.arraySize * ref) + (ulong)value0Info.type);
        local_674 = ref;
        if (local_670 != ref) break;
        ref = ref + 1;
      }
      bufMap_1.m_ptr._7_1_ = 1;
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_738,"Comparison failed for Out0.values[",&local_739);
      de::toString<unsigned_int>(&local_760,&ref);
      std::operator+(&local_718,&local_738,&local_760);
      std::operator+(&local_6f8,&local_718,"] res=");
      de::toString<unsigned_int>(&local_780,&local_670);
      std::operator+(&local_6d8,&local_6f8,&local_780);
      std::operator+(&local_6b8,&local_6d8," ref=");
      de::toString<unsigned_int>(&local_7a0,&local_674);
      std::operator+(&local_698,&local_6b8,&local_7a0);
      tcu::TestError::TestError(pTVar14,&local_698);
      bufMap_1.m_ptr._7_1_ = 0;
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,(char *)0x0,"value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x213);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Out0 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out0;\n"
			<< "layout(binding = 1) buffer Out1 {\n"
			<< "    uint values[" << (m_isSized ? de::toString(m_numValues) : string("")) << "];\n"
			<< "} sb_out1;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size      = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint groupNdx   = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out0.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out0.values[offset + ndx] = offset + ndx;\n"
			<< "    }\n"
			<< "    {\n"
			<< "        uint numValuesPerInv = uint(sb_out1.values.length()) / (size.x*size.y*size.z);\n"
			<< "        uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "        for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "            sb_out1.values[offset + ndx] = uint(sb_out1.values.length()) - offset - ndx;\n"
			<< "    }\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		const Buffer				outputBuffer0	(m_context.getRenderContext());
		const deUint32				value0Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out0.values");
		const InterfaceVariableInfo	value0Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value0Index);
		const deUint32				block0Size		= value0Info.arrayStride*(deUint32)m_numValues;

		const Buffer				outputBuffer1	(m_context.getRenderContext());
		const deUint32				value1Index		= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Out1.values");
		const InterfaceVariableInfo	value1Info		= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, value1Index);
		const deUint32				block1Size		= value1Info.arrayStride*(deUint32)m_numValues;

		TCU_CHECK(value0Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));
		TCU_CHECK(value1Info.arraySize == (deUint32)(m_isSized ? m_numValues : 0));

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block0Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, block1Size, DE_NULL, GL_STREAM_DRAW);

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, *outputBuffer1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer0);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block0Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value0Info.offset + value0Info.arrayStride*ndx));
				const deUint32	ref		= ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out0.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer1);
		{
			const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, block1Size, GL_MAP_READ_BIT);

			for (deUint32 ndx = 0; ndx < (deUint32)m_numValues; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + value1Info.offset + value1Info.arrayStride*ndx));
				const deUint32	ref		= m_numValues - ndx;

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Out1.values[") + de::toString(ndx) + "] res=" + de::toString(res) + " ref=" + de::toString(ref));
			}
		}
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}